

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.h
# Opt level: O0

result_type_conflict utility::get_random<unsigned_long>(unsigned_long min,unsigned_long max)

{
  int iVar1;
  result_type rVar2;
  result_type_conflict rVar3;
  unsigned_long max_local;
  unsigned_long min_local;
  
  if (get_random<unsigned_long>(unsigned_long,unsigned_long)::rd == '\0') {
    iVar1 = __cxa_guard_acquire(&get_random<unsigned_long>(unsigned_long,unsigned_long)::rd);
    if (iVar1 != 0) {
      std::random_device::random_device(&get_random<unsigned_long>::rd);
      __cxa_atexit(std::random_device::~random_device,&get_random<unsigned_long>::rd,&__dso_handle);
      __cxa_guard_release(&get_random<unsigned_long>(unsigned_long,unsigned_long)::rd);
    }
  }
  if (get_random<unsigned_long>(unsigned_long,unsigned_long)::engine == '\0') {
    iVar1 = __cxa_guard_acquire(&get_random<unsigned_long>(unsigned_long,unsigned_long)::engine);
    if (iVar1 != 0) {
      rVar2 = std::random_device::operator()(&get_random<unsigned_long>::rd);
      std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
      linear_congruential_engine(&get_random<unsigned_long>::engine,(ulong)rVar2);
      __cxa_guard_release(&get_random<unsigned_long>(unsigned_long,unsigned_long)::engine);
    }
  }
  if (get_random<unsigned_long>(unsigned_long,unsigned_long)::rand == '\0') {
    iVar1 = __cxa_guard_acquire(&get_random<unsigned_long>(unsigned_long,unsigned_long)::rand);
    if (iVar1 != 0) {
      std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
                (&get_random<unsigned_long>::rand,min,max);
      __cxa_guard_release(&get_random<unsigned_long>(unsigned_long,unsigned_long)::rand);
    }
  }
  rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                    (&get_random<unsigned_long>::rand,&get_random<unsigned_long>::engine);
  return rVar3;
}

Assistant:

auto get_random(T min = 0, T max = std::numeric_limits<std::uint64_t>::max()) {
  static std::random_device rd;
  static std::default_random_engine engine(rd());
  static std::uniform_int_distribution<std::uint64_t> rand(min, max);
  return rand(engine);
}